

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

void __thiscall ON_RevSurface::DestroyRuntimeCache(ON_RevSurface *this,bool bDelete)

{
  ON_Curve *pOVar1;
  
  ON_Surface::DestroyRuntimeCache(&this->super_ON_Surface,bDelete);
  pOVar1 = this->m_curve;
  if (pOVar1 != (ON_Curve *)0x0) {
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])(pOVar1,(ulong)bDelete);
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}